

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O0

void NULLCCanvas::CanvasClearRGB(float red,float green,float blue,Canvas *ptr)

{
  char *pcVar1;
  int local_30;
  int i;
  float fBlue;
  float fGreen;
  float fRed;
  Canvas *ptr_local;
  float blue_local;
  float green_local;
  float red_local;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
  }
  else {
    for (local_30 = 0; local_30 < ptr->width * ptr->height; local_30 = local_30 + 1) {
      *(float *)((ptr->data).ptr + (long)(local_30 << 2) * 4) = red / 255.0;
      *(float *)((ptr->data).ptr + (long)(local_30 * 4 + 1) * 4) = green / 255.0;
      *(float *)((ptr->data).ptr + (long)(local_30 * 4 + 2) * 4) = blue / 255.0;
      pcVar1 = (ptr->data).ptr + (long)(local_30 * 4 + 3) * 4;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = -0x80;
      pcVar1[3] = '?';
    }
  }
  return;
}

Assistant:

void CanvasClearRGB(float red, float green, float blue, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		float fRed = red / 255.0f;
		float fGreen = green / 255.0f;
		float fBlue = blue / 255.0f;
		for(int i = 0; i < ptr->width * ptr->height; i++)
		{
			((float*)ptr->data.ptr)[i * 4 + 0] = fRed;
			((float*)ptr->data.ptr)[i * 4 + 1] = fGreen;
			((float*)ptr->data.ptr)[i * 4 + 2] = fBlue;
			((float*)ptr->data.ptr)[i * 4 + 3] = 1.0f;
		}
	}